

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

void loadFunction(LoadState *S,Proto *f,TString *psource)

{
  lu_byte lVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  TString *pTVar4;
  size_t sVar5;
  size_t sVar6;
  Instruction *b;
  TValue *pTVar7;
  lu_byte *plVar8;
  Upvaldesc *pUVar9;
  Proto **ppPVar10;
  Proto *pPVar11;
  ls_byte *b_00;
  AbsLineInfo *pAVar12;
  LocVar *pLVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  lua_Number x;
  undefined8 local_38;
  
  local_38 = in_RAX;
  pTVar4 = loadStringN(S,f);
  if (pTVar4 != (TString *)0x0) {
    psource = pTVar4;
  }
  f->source = psource;
  sVar5 = loadUnsigned(S,0x7fffffff);
  f->linedefined = (int)sVar5;
  sVar5 = loadUnsigned(S,0x7fffffff);
  f->lastlinedefined = (int)sVar5;
  lVar1 = loadByte(S);
  f->numparams = lVar1;
  lVar1 = loadByte(S);
  f->is_vararg = lVar1;
  lVar1 = loadByte(S);
  f->maxstacksize = lVar1;
  sVar6 = loadUnsigned(S,0x7fffffff);
  sVar5 = (long)(int)sVar6 * 4;
  b = (Instruction *)luaM_malloc_(S->L,sVar5,0);
  f->code = b;
  f->sizecode = (int)sVar6;
  loadBlock(S,b,sVar5);
  sVar5 = loadUnsigned(S,0x7fffffff);
  uVar16 = (uint)sVar5;
  pTVar7 = (TValue *)luaM_malloc_(S->L,(long)(int)uVar16 << 4,0);
  f->k = pTVar7;
  f->sizek = uVar16;
  if (0 < (int)uVar16) {
    uVar14 = (ulong)(uVar16 & 0x7fffffff);
    plVar8 = &pTVar7->tt_;
    do {
      *plVar8 = '\0';
      plVar8 = plVar8 + 0x10;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    if (0 < (int)uVar16) {
      uVar14 = (ulong)(uVar16 & 0x7fffffff);
      lVar15 = 0;
      do {
        pTVar7 = f->k;
        bVar2 = loadByte(S);
        if (bVar2 < 0x11) {
          if (bVar2 < 2) goto LAB_001517b2;
          if (bVar2 == 3) {
            loadBlock(S,&local_38,8);
            *(undefined8 *)((long)&pTVar7->value_ + lVar15) = local_38;
            bVar2 = 3;
            goto LAB_001517b2;
          }
          if (bVar2 == 4) goto LAB_00151777;
        }
        else {
          if (bVar2 != 0x11) {
            if (bVar2 == 0x14) {
LAB_00151777:
              pTVar4 = loadStringN(S,f);
              if (pTVar4 == (TString *)0x0) {
                error(S,"bad format for constant string");
              }
              *(TString **)((long)&pTVar7->value_ + lVar15) = pTVar4;
              bVar2 = pTVar4->tt | 0x40;
            }
            else {
              if (bVar2 != 0x13) goto LAB_001517b7;
              loadBlock(S,&local_38,8);
              *(undefined8 *)((long)&pTVar7->value_ + lVar15) = local_38;
              bVar2 = 0x13;
            }
          }
LAB_001517b2:
          (&pTVar7->tt_)[lVar15] = bVar2;
        }
LAB_001517b7:
        lVar15 = lVar15 + 0x10;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  sVar5 = loadUnsigned(S,0x7fffffff);
  uVar16 = (uint)sVar5;
  pUVar9 = (Upvaldesc *)luaM_malloc_(S->L,(long)(int)uVar16 << 4,0);
  f->upvalues = pUVar9;
  f->sizeupvalues = uVar16;
  if (0 < (int)uVar16) {
    uVar14 = (ulong)(uVar16 & 0x7fffffff);
    do {
      pUVar9->name = (TString *)0x0;
      pUVar9 = pUVar9 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    if (0 < (int)uVar16) {
      uVar14 = (ulong)(uVar16 & 0x7fffffff);
      lVar15 = 0;
      do {
        lVar1 = loadByte(S);
        (&f->upvalues->instack)[lVar15] = lVar1;
        lVar1 = loadByte(S);
        (&f->upvalues->idx)[lVar15] = lVar1;
        lVar1 = loadByte(S);
        (&f->upvalues->kind)[lVar15] = lVar1;
        lVar15 = lVar15 + 0x10;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  sVar5 = loadUnsigned(S,0x7fffffff);
  uVar16 = (uint)sVar5;
  ppPVar10 = (Proto **)luaM_malloc_(S->L,(long)(int)uVar16 * 8,0);
  f->p = ppPVar10;
  f->sizep = uVar16;
  if (0 < (int)uVar16) {
    uVar14 = 0;
    do {
      f->p[uVar14] = (Proto *)0x0;
      uVar14 = uVar14 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar14);
  }
  if (0 < (int)uVar16) {
    uVar14 = 0;
    do {
      pPVar11 = luaF_newproto(S->L);
      f->p[uVar14] = pPVar11;
      if (((f->marked & 0x20) != 0) && ((f->p[uVar14]->marked & 0x18) != 0)) {
        luaC_barrier_(S->L,(GCObject *)f,(GCObject *)f->p[uVar14]);
      }
      loadFunction(S,f->p[uVar14],f->source);
      uVar14 = uVar14 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar14);
  }
  sVar5 = loadUnsigned(S,0x7fffffff);
  iVar3 = (int)sVar5;
  b_00 = (ls_byte *)luaM_malloc_(S->L,(long)iVar3,0);
  f->lineinfo = b_00;
  f->sizelineinfo = iVar3;
  loadBlock(S,b_00,(long)iVar3);
  sVar5 = loadUnsigned(S,0x7fffffff);
  uVar16 = (uint)sVar5;
  pAVar12 = (AbsLineInfo *)luaM_malloc_(S->L,(long)(int)uVar16 * 8,0);
  f->abslineinfo = pAVar12;
  f->sizeabslineinfo = uVar16;
  if (0 < (int)uVar16) {
    uVar14 = 0;
    do {
      sVar5 = loadUnsigned(S,0x7fffffff);
      f->abslineinfo[uVar14].pc = (int)sVar5;
      sVar5 = loadUnsigned(S,0x7fffffff);
      f->abslineinfo[uVar14].line = (int)sVar5;
      uVar14 = uVar14 + 1;
    } while ((uVar16 & 0x7fffffff) != uVar14);
  }
  sVar5 = loadUnsigned(S,0x7fffffff);
  uVar17 = (uint)sVar5;
  uVar16 = 0;
  pLVar13 = (LocVar *)luaM_malloc_(S->L,(long)(int)uVar17 << 4,0);
  f->locvars = pLVar13;
  f->sizelocvars = uVar17;
  if (0 < (int)uVar17) {
    uVar14 = (ulong)(uVar17 & 0x7fffffff);
    do {
      pLVar13->varname = (TString *)0x0;
      pLVar13 = pLVar13 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    if (0 < (int)uVar17) {
      uVar14 = (ulong)(uVar17 & 0x7fffffff);
      lVar15 = 0;
      do {
        pTVar4 = loadStringN(S,f);
        *(TString **)((long)&f->locvars->varname + lVar15) = pTVar4;
        sVar5 = loadUnsigned(S,0x7fffffff);
        *(int *)((long)&f->locvars->startpc + lVar15) = (int)sVar5;
        sVar5 = loadUnsigned(S,0x7fffffff);
        *(int *)((long)&f->locvars->endpc + lVar15) = (int)sVar5;
        lVar15 = lVar15 + 0x10;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  sVar5 = loadUnsigned(S,0x7fffffff);
  if ((int)sVar5 != 0) {
    uVar16 = f->sizeupvalues;
  }
  if (0 < (int)uVar16) {
    lVar15 = 0;
    do {
      pTVar4 = loadStringN(S,f);
      *(TString **)((long)&f->upvalues->name + lVar15) = pTVar4;
      lVar15 = lVar15 + 0x10;
    } while ((ulong)uVar16 << 4 != lVar15);
  }
  return;
}

Assistant:

static void loadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = loadStringN(S, f);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->is_vararg = loadByte(S);
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadDebug(S, f);
}